

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O0

string * __thiscall
umu::_union_map_union_Union__0__::get_string_abi_cxx11_(_union_map_union_Union__0__ *this)

{
  Exception *this_00;
  long *in_RSI;
  string *in_RDI;
  string *in_stack_ffffffffffffff88;
  any *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (*in_RSI != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    avro::Exception::Exception(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
  }
  boost::any_cast<std::__cxx11::string>(in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

inline
std::string _union_map_union_Union__0__::get_string() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::string >(value_);
}